

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

csubstr __thiscall c4::yml::Parser::_consume_scalar(Parser *this)

{
  State *pSVar1;
  code *pcVar2;
  bool bVar3;
  csubstr cVar4;
  
  if ((this->m_state->flags & 0x200) == 0) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        cVar4 = (csubstr)(*pcVar2)();
        return cVar4;
      }
    }
    (*(code *)PTR_error_impl_0029b798)
              ("check failed: m_state->flags & SSCL",0x23,(anonymous_namespace)::s_default_callbacks
              );
  }
  pSVar1 = this->m_state;
  cVar4 = pSVar1->scalar;
  pSVar1->flags = pSVar1->flags & 0xfffff9ff;
  (pSVar1->scalar).str = (char *)0x0;
  (pSVar1->scalar).len = 0;
  return cVar4;
}

Assistant:

csubstr Parser::_consume_scalar()
{
    _c4dbgpf("state[{}]: consuming scalar '{}' (flag: {}))", m_state-m_stack.begin(), m_state->scalar, m_state->flags & SSCL);
    RYML_CHECK(m_state->flags & SSCL);
    csubstr s = m_state->scalar;
    rem_flags(SSCL | QSCL);
    m_state->scalar.clear();
    return s;
}